

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseLoop(Parser *this)

{
  initializer_list<Jinx::Impl::SymbolType> symbols;
  bool bVar1;
  bool bVar2;
  RuntimeID RVar3;
  size_t sVar4;
  size_t sVar5;
  bool jumpTrue_1;
  size_t loopBeginAddress_3;
  size_t loopJumpAddress;
  bool jumpTrue;
  size_t loopBeginAddress_2;
  size_t loopBeginAddress_1;
  size_t emptyLoopJumpAddress;
  size_t loopBeginAddress;
  undefined4 local_8c;
  char *local_88 [3];
  SymbolType local_70 [4];
  iterator local_60;
  undefined8 local_58;
  String local_50;
  undefined1 local_30 [8];
  String name;
  Parser *this_local;
  
  name.field_2._8_8_ = this;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_30);
  bVar1 = CheckName(this);
  if (bVar1) {
    local_70[0] = From;
    local_70[1] = 0x38;
    local_70[2] = 0x41;
    local_70[3] = 0x43;
    local_60 = local_70;
    local_58 = 4;
    symbols._M_len = 4;
    symbols._M_array = local_60;
    ParseMultiName_abi_cxx11_(&local_50,this,symbols);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_30,
               &local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_50);
    bVar1 = VariableExists(this,(basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                 *)local_30);
    if (bVar1) {
      local_88[0] = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                            local_30);
      Error<char_const*>(this,"Variable name \'%s\' already exists in this scope",local_88);
      local_8c = 1;
      goto LAB_0016cd66;
    }
  }
  bVar1 = Accept(this,From);
  if (bVar1) {
    ScopeBegin(this);
    ParseExpression(this);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       local_30);
    if (!bVar1) {
      VariableAssign(this,(String *)local_30);
      EmitOpcode(this,SetVar);
      RVar3 = VariableNameToRuntimeID(this,(String *)local_30);
      EmitId(this,RVar3);
    }
    Expect(this,To,(char *)0x0);
    ParseExpression(this);
    bVar1 = Accept(this,By);
    if (bVar1) {
      ParseExpression(this);
    }
    else {
      EmitOpcode(this,PushVal);
      Variant::Variant((Variant *)&loopBeginAddress,(nullptr_t)0x0);
      EmitValue(this,(Variant *)&loopBeginAddress);
      Variant::~Variant((Variant *)&loopBeginAddress);
    }
    Expect(this,NewLine,(char *)0x0);
    sVar5 = BinaryWriter::Tell(&this->m_writer);
    ParseBlock(this);
    Expect(this,End,(char *)0x0);
    Expect(this,NewLine,(char *)0x0);
    EmitOpcode(this,LoopCount);
    EmitOpcode(this,JumpTrue);
    EmitAddress(this,sVar5);
    ScopeEnd(this);
  }
  else {
    bVar1 = Accept(this,Over);
    if (bVar1) {
      ScopeBegin(this);
      ParseExpression(this);
      bVar1 = Expect(this,NewLine,(char *)0x0);
      if (!bVar1) {
        local_8c = 1;
        goto LAB_0016cd66;
      }
      EmitOpcode(this,PushTop);
      EmitOpcode(this,JumpFalse);
      sVar5 = EmitAddressPlaceholder(this);
      EmitOpcode(this,PushItr);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_30);
      if (!bVar1) {
        VariableAssign(this,(String *)local_30);
        EmitOpcode(this,SetVar);
        RVar3 = VariableNameToRuntimeID(this,(String *)local_30);
        EmitId(this,RVar3);
      }
      sVar4 = BinaryWriter::Tell(&this->m_writer);
      ParseBlock(this);
      Expect(this,End,(char *)0x0);
      Expect(this,NewLine,(char *)0x0);
      EmitOpcode(this,LoopOver);
      EmitOpcode(this,JumpFalse);
      EmitAddress(this,sVar4);
      EmitAddressBackfill(this,sVar5);
      ScopeEnd(this);
    }
    else {
      bVar1 = Check(this,Until);
      if ((bVar1) || (bVar1 = Check(this,While), bVar1)) {
        sVar5 = BinaryWriter::Tell(&this->m_writer);
        bVar1 = Accept(this,Until);
        if (!bVar1) {
          Expect(this,While,(char *)0x0);
        }
        ParseExpression(this);
        bVar2 = Expect(this,NewLine,(char *)0x0);
        if (!bVar2) {
          local_8c = 1;
          goto LAB_0016cd66;
        }
        EmitOpcode(this,(uint)bVar1 * 2 + JumpFalse);
        sVar4 = EmitAddressPlaceholder(this);
        ParseBlock(this);
        Expect(this,End,(char *)0x0);
        Expect(this,NewLine,(char *)0x0);
        EmitOpcode(this,Jump);
        EmitAddress(this,sVar5);
        EmitAddressBackfill(this,sVar4);
      }
      else {
        bVar1 = Accept(this,NewLine);
        if (!bVar1) {
          Error<>(this,"Unknown syntax after loop keyword");
          local_8c = 1;
          goto LAB_0016cd66;
        }
        sVar5 = BinaryWriter::Tell(&this->m_writer);
        ParseBlock(this);
        bVar1 = Accept(this,While);
        if (!bVar1) {
          Expect(this,Until,(char *)0x0);
        }
        ParseExpression(this);
        Expect(this,NewLine,(char *)0x0);
        EmitOpcode(this,(uint)bVar1 * 2 + JumpFalse);
        EmitAddress(this,sVar5);
      }
    }
  }
  if (this->m_breakAddress != 0) {
    EmitAddressBackfill(this,this->m_breakAddress);
    this->m_breakAddress = 0;
  }
  local_8c = 0;
LAB_0016cd66:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_30);
  return;
}

Assistant:

inline_t void Parser::ParseLoop()
	{
		// Check to see if we're using an explicitly named variable for the loop counter
		String name;
		if (CheckName())
		{
			// Parse initial name part
			name = ParseMultiName({ SymbolType::From, SymbolType::Over, SymbolType::Until, SymbolType::While });

			// Make sure the variable name doesn't already exist
			if (VariableExists(name))
			{
				Error("Variable name '%s' already exists in this scope", name.c_str());
				return;
			}
		}

		// We're looping using a counter
		if (Accept(SymbolType::From))
		{
			// Begin scope for loop control variables
			ScopeBegin();

			// Parse from value
			ParseExpression();

			// Assign the counter to a variable name if it exists
			if (!name.empty())
			{
				VariableAssign(name);
				EmitOpcode(Opcode::SetVar);
				EmitId(VariableNameToRuntimeID(name));
			}

			// Parse to value
			Expect(SymbolType::To);
			ParseExpression();

			// Parse increment amount
			if (Accept(SymbolType::By))
			{
				ParseExpression();
			}
			else
			{
				EmitOpcode(Opcode::PushVal);
				EmitValue(nullptr);
			}
			Expect(SymbolType::NewLine);

			// Mark where the loop count evaluation has to jump
			auto loopBeginAddress = m_writer.Tell();

			// Evaluate code block inside loop
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Advance counter and evaluate
			EmitOpcode(Opcode::LoopCount);

			// Evaluate result of loop count instruction
			EmitOpcode(Opcode::JumpTrue);
			EmitAddress(loopBeginAddress);

			// End loop scope
			ScopeEnd();
		}
		// We're looping over a collection
		else if (Accept(SymbolType::Over))
		{
			// Begin scope for loop control variables
			ScopeBegin();

			// Parse the collection
			ParseExpression();
			if (!Expect(SymbolType::NewLine))
				return;

			// Check to see if the collection is empty, and if so, skip the loop
			EmitOpcode(Opcode::PushTop);
			EmitOpcode(Opcode::JumpFalse);
			auto emptyLoopJumpAddress = EmitAddressPlaceholder();

			// Retrieve collection from top of stack and push iterator from beginning position
			EmitOpcode(Opcode::PushItr);

			// Assign the iterator to a variable name if it exists
			if (!name.empty())
			{
				VariableAssign(name);
				EmitOpcode(Opcode::SetVar);
				EmitId(VariableNameToRuntimeID(name));
			}

			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Parse the while loop block
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Increment iterator and test against collection end
			EmitOpcode(Opcode::LoopOver);
			EmitOpcode(Opcode::JumpFalse);
			EmitAddress(loopBeginAddress);

			// Backfill empty loop jump address
			EmitAddressBackfill(emptyLoopJumpAddress);

			// End loop scope
			ScopeEnd();

		}
		// Loops while a condition is true or false
		else if (Check(SymbolType::Until) || Check(SymbolType::While))
		{
			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Check for keyword
			bool jumpTrue = Accept(SymbolType::Until);
			if (!jumpTrue)
				Expect(SymbolType::While);

			// Parse the expression to control the loop's jump branch
			ParseExpression();
			if (!Expect(SymbolType::NewLine))
				return;

			// Add jump instruction, making sure to store the jump address for later backfilling
			EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);
			auto loopJumpAddress = EmitAddressPlaceholder();

			// Parse the while loop block
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Jump to top of loop
			EmitOpcode(Opcode::Jump);
			EmitAddress(loopBeginAddress);

			// Backfill loop jump target address
			EmitAddressBackfill(loopJumpAddress);
		}
		// Executes once and then loops again while a condition is true/false, depending on keyword used
		else if (Accept(SymbolType::NewLine))
		{
			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Parse the until/while loop block
			ParseBlock();

			// Check the keyword is used
			bool jumpTrue = Accept(SymbolType::While);
			if (!jumpTrue)
				Expect(SymbolType::Until);

			// Parse expression used to determine if loop should execute again
			ParseExpression();
			Expect(SymbolType::NewLine);

			// Conditionally jump to top of loop
			EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);
			EmitAddress(loopBeginAddress);
		}
		else
		{
			Error("Unknown syntax after loop keyword");
			return;
		}

		// If we used a break somewhere inside the loop, backfill the address now
		if (m_breakAddress)
		{
			EmitAddressBackfill(m_breakAddress);
			m_breakAddress = 0;
		}
	}